

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_java_struct_equality
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  e_req eVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  t_type *ptVar8;
  long *plVar9;
  undefined8 *puVar10;
  logic_error *this_00;
  size_type *psVar11;
  pointer pptVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  undefined1 auVar15 [12];
  string name;
  string this_present;
  string that_present;
  string unequal;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  t_struct *local_a0;
  string local_98;
  string local_78;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = tstruct;
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"@Override",9);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"public boolean equals(java.lang.Object that) {",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (that instanceof ",0x14);
  iVar6 = (*(local_a0->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return this.equals((",0x16);
  iVar6 = (*(local_a0->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_00,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")that);",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return false;",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public boolean equals(",0x16);
  iVar6 = (*(local_a0->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_01,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_01,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," that) {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (that == null)",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (this == that)",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return true;",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  pptVar12 = (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar12 !=
      (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      ptVar8 = t_type::get_true_type((*pptVar12)->type_);
      eVar3 = (*pptVar12)->req_;
      bVar5 = type_can_be_null(this,ptVar8);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
      local_58 = pptVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"true","");
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"true","");
      pptVar12 = local_58;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      if (eVar3 == T_OPTIONAL || bVar5) {
        generate_isset_check_abi_cxx11_(&local_e0,this,*local_58);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x399a99);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120.field_2._8_8_ = plVar9[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_120._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        generate_isset_check_abi_cxx11_(&local_e0,this,*pptVar12);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x393778);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120.field_2._8_8_ = plVar9[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_120._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_120._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"boolean this_present_",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_e0,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"boolean that_present_",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"this_present_",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," || that_present_",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (!(",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"this_present_",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," && that_present_",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"))",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_e0,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[7])(ptVar8);
      paVar2 = &local_98.field_2;
      if ((char)iVar6 == '\0') {
        if (bVar5) {
          std::operator+(&local_50,"!this.",&local_140);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          psVar11 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_98.field_2._M_allocated_capacity = *psVar11;
            local_98.field_2._8_8_ = puVar10[3];
            local_98._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar11;
            local_98._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_98._M_string_length = puVar10[1];
          *puVar10 = psVar11;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_98,(ulong)local_140._M_dataplus._M_p);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          psVar11 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_e0._M_string_length = puVar10[1];
          *puVar10 = psVar11;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
          goto LAB_0025b366;
        }
        std::operator+(&local_98,"this.",&local_140);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0.field_2._8_8_ = plVar9[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_e0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_e0,(ulong)local_140._M_dataplus._M_p);
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120.field_2._8_8_ = puVar10[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_120._M_string_length = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        _Var13._M_p = local_98._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar2) goto LAB_0025b411;
      }
      else {
        std::operator+(&local_50,"!this.",&local_140);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_98.field_2._M_allocated_capacity = *psVar11;
          local_98.field_2._8_8_ = plVar9[3];
          local_98._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar11;
          local_98._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_98._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_98,(ulong)local_140._M_dataplus._M_p);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_e0._M_string_length = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
LAB_0025b366:
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120.field_2._8_8_ = puVar10[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_120._M_string_length = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        _Var13._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0025b411:
          operator_delete(_Var13._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_120._M_dataplus._M_p,local_120._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_e0,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pptVar12 = local_58;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pptVar12 = pptVar12 + 1;
    } while (pptVar12 !=
             (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"@Override",9);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public int hashCode() {",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"int hashCode = 1;",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar12 = (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar12 !=
      (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar8 = t_type::get_true_type((*pptVar12)->type_);
    bVar14 = (*pptVar12)->req_ == T_OPTIONAL;
    bVar5 = type_can_be_null(this,ptVar8);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
    if (bVar5 || bVar14) {
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ((",5);
      generate_isset_check_abi_cxx11_(&local_100,this,*pptVar12);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ? ",4);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1ffff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," : ",3);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x7ffff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      poVar7 = t_generator::indent((t_generator *)this,out);
      generate_isset_check_abi_cxx11_(&local_78,this,*pptVar12);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x37bd92);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_c0.field_2._M_allocated_capacity = *psVar11;
        local_c0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar11;
        local_c0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_c0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_100.field_2._M_allocated_capacity = *psVar11;
        local_100.field_2._8_8_ = plVar9[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar11;
        local_100._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_100._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
    }
    iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[10])(ptVar8);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
      if ((char)iVar6 == '\0') {
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".hashCode();",0xc);
      }
      else {
        switch(*(undefined4 *)&ptVar8[1].super_t_doc._vptr_t_doc) {
        case 0:
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"compiler error: a struct field cannot be void");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        case 1:
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,".hashCode();",0xc);
          break;
        case 2:
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ((",5);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ? ",4);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1ffff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," : ",3);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x7ffff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          break;
        case 3:
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," + (int) (",10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          break;
        case 4:
        case 5:
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
          break;
        case 6:
        case 7:
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," + org.apache.thrift.TBaseHelper.hashCode(",0x2a);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          break;
        default:
          auVar15 = __cxa_allocate_exception(0x10);
          t_base_type::t_base_name_abi_cxx11_
                    (&local_c0,(t_base_type *)(ulong)*(uint *)&ptVar8[1].super_t_doc._vptr_t_doc,
                     auVar15._8_4_);
          std::operator+(&local_100,
                         "compiler error: the following base type has no hashcode generator: ",
                         &local_c0);
          std::logic_error::logic_error(auVar15._0_8_,(string *)&local_100);
          __cxa_throw(auVar15._0_8_,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
    }
    else {
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"hashCode = hashCode * ",0x16);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".getValue();",0xc);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (bVar5 || bVar14) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return hashCode;",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_equality(ostream& out, t_struct* tstruct) {
  out << indent() << "@Override" << endl << indent() << "public boolean equals(java.lang.Object that) {"
      << endl;
  indent_up();
  out << indent() << "if (that instanceof " << tstruct->get_name() << ")" << endl << indent()
      << "  return this.equals((" << tstruct->get_name() << ")that);" << endl << indent()
      << "return false;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public boolean equals(" << tstruct->get_name() << " that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (this == that)" << endl << indent() << "  return true;"  << endl;

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    // Most existing Thrift code does not use isset or optional/required,
    // so we treat "default" fields as required.
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    string this_present = "true";
    string that_present = "true";
    string unequal;

    if (is_optional || can_be_null) {
      this_present += " && this." + generate_isset_check(*m_iter);
      that_present += " && that." + generate_isset_check(*m_iter);
    }

    out << indent() << "boolean this_present_" << name << " = " << this_present << ";" << endl
        << indent() << "boolean that_present_" << name << " = " << that_present << ";" << endl
        << indent() << "if ("
        << "this_present_" << name << " || that_present_" << name << ") {" << endl;
    indent_up();
    out << indent() << "if (!("
        << "this_present_" << name << " && that_present_" << name << "))" << endl << indent()
        << "  return false;" << endl;

    if (t->is_binary()) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else if (can_be_null) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else {
      unequal = "this." + name + " != that." + name;
    }

    out << indent() << "if (" << unequal << ")" << endl << indent() << "  return false;" << endl;

    scope_down(out);
  }
  out << endl;
  indent(out) << "return true;" << endl;
  scope_down(out);
  out << endl;

  const int MUL = 8191; // HashCode multiplier
  const int B_YES = 131071;
  const int B_NO = 524287;
  out << indent() << "@Override" << endl << indent() << "public int hashCode() {" << endl;
  indent_up();
  indent(out) << "int hashCode = 1;" << endl;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    if (is_optional || can_be_null) {
      indent(out) << "hashCode = hashCode * " << MUL << " + ((" << generate_isset_check(*m_iter)
                  << ") ? " << B_YES << " : " << B_NO << ");" << endl;
    }

    if (is_optional || can_be_null) {
      indent(out) << "if (" + generate_isset_check(*m_iter) + ")" << endl;
      indent_up();
    }

    if (t->is_enum()) {
      indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".getValue();" << endl;
    } else if (t->is_base_type()) {
      switch(((t_base_type*)t)->get_base()) {
      case t_base_type::TYPE_STRING:
        indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".hashCode();" << endl;
        break;
      case t_base_type::TYPE_BOOL:
        indent(out) << "hashCode = hashCode * " << MUL << " + ((" << name << ") ? "
                    << B_YES << " : " << B_NO << ");" << endl;
        break;
      case t_base_type::TYPE_I8:
        indent(out) << "hashCode = hashCode * " << MUL << " + (int) (" << name << ");" << endl;
        break;
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
        indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ";" << endl;
        break;
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        indent(out) << "hashCode = hashCode * " << MUL << " + org.apache.thrift.TBaseHelper.hashCode(" << name << ");" << endl;
        break;
      case t_base_type::TYPE_VOID:
        throw std::logic_error("compiler error: a struct field cannot be void");
      default:
        throw std::logic_error("compiler error: the following base type has no hashcode generator: " +
               t_base_type::t_base_name(((t_base_type*)t)->get_base()));
      }
    } else {
      indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".hashCode();" << endl;
    }

    if (is_optional || can_be_null) {
      indent_down();
    }
  }

  out << endl;
  indent(out) << "return hashCode;" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}